

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::
resizeHelper<false,unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value)

{
  pointer begin_00;
  pointer end_00;
  size_t j;
  uchar *data;
  size_type sVar1;
  size_t sVar2;
  uchar *puVar3;
  ulong uVar4;
  unsigned_long *it;
  unsigned_long *puVar5;
  size_t j_1;
  size_type __n;
  ulong dimension;
  allocator_type local_179;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  size_t x;
  Geometry<std::allocator<unsigned_long>_> local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> view2;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> viewT;
  
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = 1;
  for (puVar5 = begin; puVar5 != end; puVar5 = puVar5 + 1) {
    x = *puVar5;
    marray_detail::Assert<bool>(x != 0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&newShape,&x);
    __n = __n * x;
  }
  data = __gnu_cxx::new_allocator<unsigned_char>::allocate
                   ((new_allocator<unsigned_char> *)(this + 0x40),__n,(void *)0x0);
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    data[sVar1] = *value;
  }
  puVar3 = *(uchar **)this;
  if (puVar3 == (uchar *)0x0) goto LAB_00106e92;
  if (__n == 1) {
LAB_00106e7c:
    *data = *puVar3;
  }
  else {
    sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar2 == 0) {
      puVar3 = *(uchar **)this;
      goto LAB_00106e7c;
    }
    sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&base1,sVar2,(allocator_type *)&x);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&base2,(long)newShape.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)newShape.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&x);
    sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    x = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&shape1,sVar2,&x,(allocator_type *)&viewT);
    x = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&shape2,(long)newShape.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)newShape.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3,&x,
               (allocator_type *)&viewT);
    dimension = 0;
    while( true ) {
      sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
      uVar4 = (long)newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      if (sVar2 <= uVar4) {
        uVar4 = sVar2;
      }
      if (uVar4 <= dimension) break;
      sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,
                         dimension);
      if (newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[dimension] < sVar2) {
        sVar2 = newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[dimension];
      }
      shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[dimension] = sVar2;
      shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[dimension] = sVar2;
      dimension = dimension + 1;
    }
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
              ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&x,
               (allocator_type *)&viewT);
    View<unsigned_char,false,std::allocator<unsigned_long>>::
    constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&x);
    end_00 = newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    begin_00 = newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    View<unsigned_char,false,std::allocator<unsigned_long>>::
    View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&viewT,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )begin_00,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )end_00,data,(CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
               (allocator_type *)&view2);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View(&view2,&local_179);
    View<unsigned_char,false,std::allocator<unsigned_long>>::
    view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)&viewT,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,&view2);
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::squeeze
              ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&x);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::squeeze(&view2);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator=
              (&view2,(View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&x);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&view2.geometry_);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&viewT.geometry_);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_148);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  operator_delete(*(void **)this,*(ulong *)(this + 0x30));
  *(undefined8 *)this = 0;
LAB_00106e92:
  View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
            ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin,end,data,
             (CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),(allocator_type *)&x)
  ;
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}